

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  NodeRef *pNVar28;
  size_t sVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar65;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar84 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  UVIdentity<4> mapUV;
  NodeRef *local_1600;
  undefined1 local_1598 [16];
  undefined1 (*local_1588) [16];
  ulong local_1580;
  long local_1578;
  long local_1570;
  RTCFilterFunctionNArguments args;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  float local_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  UVIdentity<4> *local_1448;
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  RTCHitN local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined4 local_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  uint local_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  uint uStack_1340;
  uint uStack_133c;
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_11f8._4_4_ = uVar2;
  local_11f8._0_4_ = uVar2;
  local_11f8._8_4_ = uVar2;
  local_11f8._12_4_ = uVar2;
  local_11f8._16_4_ = uVar2;
  local_11f8._20_4_ = uVar2;
  local_11f8._24_4_ = uVar2;
  local_11f8._28_4_ = uVar2;
  auVar71 = ZEXT3264(local_11f8);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1218._4_4_ = uVar2;
  local_1218._0_4_ = uVar2;
  local_1218._8_4_ = uVar2;
  local_1218._12_4_ = uVar2;
  local_1218._16_4_ = uVar2;
  local_1218._20_4_ = uVar2;
  local_1218._24_4_ = uVar2;
  local_1218._28_4_ = uVar2;
  auVar78 = ZEXT3264(local_1218);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1238._4_4_ = uVar2;
  local_1238._0_4_ = uVar2;
  local_1238._8_4_ = uVar2;
  local_1238._12_4_ = uVar2;
  local_1238._16_4_ = uVar2;
  local_1238._20_4_ = uVar2;
  local_1238._24_4_ = uVar2;
  local_1238._28_4_ = uVar2;
  auVar82 = ZEXT3264(local_1238);
  fVar100 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar107 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar47 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar83 = fVar100 * 0.99999964;
  fVar58 = fVar107 * 0.99999964;
  fVar91 = fVar47 * 0.99999964;
  fVar100 = fVar100 * 1.0000004;
  fVar107 = fVar107 * 1.0000004;
  fVar47 = fVar47 * 1.0000004;
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar24 = uVar27 ^ 0x20;
  iVar3 = (tray->tnear).field_0.i[k];
  local_1318._4_4_ = iVar3;
  local_1318._0_4_ = iVar3;
  local_1318._8_4_ = iVar3;
  local_1318._12_4_ = iVar3;
  local_1318._16_4_ = iVar3;
  local_1318._20_4_ = iVar3;
  local_1318._24_4_ = iVar3;
  local_1318._28_4_ = iVar3;
  auVar115 = ZEXT3264(local_1318);
  iVar3 = (tray->tfar).field_0.i[k];
  local_1338._4_4_ = iVar3;
  local_1338._0_4_ = iVar3;
  local_1338._8_4_ = iVar3;
  local_1338._12_4_ = iVar3;
  local_1338._16_4_ = iVar3;
  local_1338._20_4_ = iVar3;
  local_1338._24_4_ = iVar3;
  local_1338._28_4_ = iVar3;
  auVar118 = ZEXT3264(local_1338);
  local_1588 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_1258 = fVar83;
  fStack_1254 = fVar83;
  fStack_1250 = fVar83;
  fStack_124c = fVar83;
  fStack_1248 = fVar83;
  fStack_1244 = fVar83;
  fStack_1240 = fVar83;
  fStack_123c = fVar83;
  local_1278 = fVar58;
  fStack_1274 = fVar58;
  fStack_1270 = fVar58;
  fStack_126c = fVar58;
  fStack_1268 = fVar58;
  fStack_1264 = fVar58;
  fStack_1260 = fVar58;
  fStack_125c = fVar58;
  local_1298 = fVar91;
  fStack_1294 = fVar91;
  fStack_1290 = fVar91;
  fStack_128c = fVar91;
  fStack_1288 = fVar91;
  fStack_1284 = fVar91;
  fStack_1280 = fVar91;
  fStack_127c = fVar91;
  local_12b8 = fVar100;
  fStack_12b4 = fVar100;
  fStack_12b0 = fVar100;
  fStack_12ac = fVar100;
  fStack_12a8 = fVar100;
  fStack_12a4 = fVar100;
  fStack_12a0 = fVar100;
  fStack_129c = fVar100;
  local_12d8 = fVar107;
  fStack_12d4 = fVar107;
  fStack_12d0 = fVar107;
  fStack_12cc = fVar107;
  fStack_12c8 = fVar107;
  fStack_12c4 = fVar107;
  fStack_12c0 = fVar107;
  fStack_12bc = fVar107;
  local_12f8 = fVar47;
  fStack_12f4 = fVar47;
  fStack_12f0 = fVar47;
  fStack_12ec = fVar47;
  fStack_12e8 = fVar47;
  fStack_12e4 = fVar47;
  fStack_12e0 = fVar47;
  fStack_12dc = fVar47;
  local_1600 = stack + 1;
  fVar52 = fVar47;
  fVar53 = fVar47;
  fVar54 = fVar47;
  fVar55 = fVar47;
  fVar56 = fVar47;
  fVar57 = fVar47;
  fVar65 = fVar58;
  fVar121 = fVar58;
  fVar122 = fVar58;
  fVar123 = fVar58;
  fVar124 = fVar58;
  fVar66 = fVar58;
  fVar85 = fVar83;
  fVar86 = fVar83;
  fVar87 = fVar83;
  fVar88 = fVar83;
  fVar89 = fVar83;
  fVar90 = fVar83;
  fVar94 = fVar91;
  fVar95 = fVar91;
  fVar96 = fVar91;
  fVar97 = fVar91;
  fVar98 = fVar91;
  fVar99 = fVar91;
  fVar101 = fVar100;
  fVar102 = fVar100;
  fVar103 = fVar100;
  fVar104 = fVar100;
  fVar105 = fVar100;
  fVar106 = fVar100;
  fVar109 = fVar107;
  fVar110 = fVar107;
  fVar111 = fVar107;
  fVar112 = fVar107;
  fVar113 = fVar107;
  fVar114 = fVar107;
  local_1580 = uVar27;
LAB_01660a7b:
  do {
    pNVar28 = local_1600;
    if (pNVar28 == stack) {
LAB_01661486:
      return pNVar28 != stack;
    }
    local_1600 = pNVar28 + -1;
    sVar29 = pNVar28[-1].ptr;
    while ((sVar29 & 8) == 0) {
      auVar13 = vsubps_avx(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar27),auVar71._0_32_);
      auVar14._4_4_ = fVar85 * auVar13._4_4_;
      auVar14._0_4_ = fVar83 * auVar13._0_4_;
      auVar14._8_4_ = fVar86 * auVar13._8_4_;
      auVar14._12_4_ = fVar87 * auVar13._12_4_;
      auVar14._16_4_ = fVar88 * auVar13._16_4_;
      auVar14._20_4_ = fVar89 * auVar13._20_4_;
      auVar14._24_4_ = fVar90 * auVar13._24_4_;
      auVar14._28_4_ = auVar13._28_4_;
      auVar13 = vsubps_avx(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar23),auVar78._0_32_);
      auVar15._4_4_ = fVar65 * auVar13._4_4_;
      auVar15._0_4_ = fVar58 * auVar13._0_4_;
      auVar15._8_4_ = fVar121 * auVar13._8_4_;
      auVar15._12_4_ = fVar122 * auVar13._12_4_;
      auVar15._16_4_ = fVar123 * auVar13._16_4_;
      auVar15._20_4_ = fVar124 * auVar13._20_4_;
      auVar15._24_4_ = fVar66 * auVar13._24_4_;
      auVar15._28_4_ = auVar13._28_4_;
      auVar13 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vsubps_avx(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar30),auVar82._0_32_);
      auVar16._4_4_ = fVar94 * auVar14._4_4_;
      auVar16._0_4_ = fVar91 * auVar14._0_4_;
      auVar16._8_4_ = fVar95 * auVar14._8_4_;
      auVar16._12_4_ = fVar96 * auVar14._12_4_;
      auVar16._16_4_ = fVar97 * auVar14._16_4_;
      auVar16._20_4_ = fVar98 * auVar14._20_4_;
      auVar16._24_4_ = fVar99 * auVar14._24_4_;
      auVar16._28_4_ = auVar14._28_4_;
      auVar14 = vmaxps_avx(auVar16,auVar115._0_32_);
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar14 = vsubps_avx(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar24),auVar71._0_32_);
      auVar17._4_4_ = fVar101 * auVar14._4_4_;
      auVar17._0_4_ = fVar100 * auVar14._0_4_;
      auVar17._8_4_ = fVar102 * auVar14._8_4_;
      auVar17._12_4_ = fVar103 * auVar14._12_4_;
      auVar17._16_4_ = fVar104 * auVar14._16_4_;
      auVar17._20_4_ = fVar105 * auVar14._20_4_;
      auVar17._24_4_ = fVar106 * auVar14._24_4_;
      auVar17._28_4_ = auVar14._28_4_;
      auVar14 = vsubps_avx(*(undefined1 (*) [32])(sVar29 + 0x40 + (uVar23 ^ 0x20)),auVar78._0_32_);
      auVar18._4_4_ = fVar109 * auVar14._4_4_;
      auVar18._0_4_ = fVar107 * auVar14._0_4_;
      auVar18._8_4_ = fVar110 * auVar14._8_4_;
      auVar18._12_4_ = fVar111 * auVar14._12_4_;
      auVar18._16_4_ = fVar112 * auVar14._16_4_;
      auVar18._20_4_ = fVar113 * auVar14._20_4_;
      auVar18._24_4_ = fVar114 * auVar14._24_4_;
      auVar18._28_4_ = auVar14._28_4_;
      auVar14 = vminps_avx(auVar17,auVar18);
      auVar15 = vsubps_avx(*(undefined1 (*) [32])(sVar29 + 0x40 + (uVar30 ^ 0x20)),auVar82._0_32_);
      auVar19._4_4_ = fVar52 * auVar15._4_4_;
      auVar19._0_4_ = fVar47 * auVar15._0_4_;
      auVar19._8_4_ = fVar53 * auVar15._8_4_;
      auVar19._12_4_ = fVar54 * auVar15._12_4_;
      auVar19._16_4_ = fVar55 * auVar15._16_4_;
      auVar19._20_4_ = fVar56 * auVar15._20_4_;
      auVar19._24_4_ = fVar57 * auVar15._24_4_;
      auVar19._28_4_ = auVar15._28_4_;
      auVar15 = vminps_avx(auVar19,auVar118._0_32_);
      auVar14 = vminps_avx(auVar14,auVar15);
      auVar13 = vcmpps_avx(auVar13,auVar14,2);
      uVar20 = vmovmskps_avx(auVar13);
      if (uVar20 == 0) goto LAB_01660a7b;
      uVar20 = uVar20 & 0xff;
      uVar21 = sVar29 & 0xfffffffffffffff0;
      lVar22 = 0;
      for (uVar26 = (ulong)uVar20; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      sVar29 = *(size_t *)(uVar21 + lVar22 * 8);
      uVar20 = uVar20 - 1 & uVar20;
      uVar26 = (ulong)uVar20;
      if (uVar20 != 0) {
        do {
          local_1600->ptr = sVar29;
          local_1600 = local_1600 + 1;
          lVar22 = 0;
          for (uVar25 = uVar26; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          sVar29 = *(size_t *)(uVar21 + lVar22 * 8);
        } while (uVar26 != 0);
      }
    }
    local_1570 = (ulong)((uint)sVar29 & 0xf) - 8;
    uVar26 = sVar29 & 0xfffffffffffffff0;
    for (local_1578 = 0; local_1578 != local_1570; local_1578 = local_1578 + 1) {
      lVar22 = local_1578 * 0x50;
      pSVar5 = context->scene;
      ppfVar6 = (pSVar5->vertices).items;
      pfVar7 = ppfVar6[*(uint *)(uVar26 + 0x30 + lVar22)];
      pfVar8 = ppfVar6[*(uint *)(uVar26 + 0x34 + lVar22)];
      pfVar9 = ppfVar6[*(uint *)(uVar26 + 0x38 + lVar22)];
      pfVar10 = ppfVar6[*(uint *)(uVar26 + 0x3c + lVar22)];
      auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + lVar22)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 8 + lVar22)));
      auVar61 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + lVar22)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 8 + lVar22)));
      auVar77 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 4 + lVar22)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 0xc + lVar22)));
      auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 4 + lVar22)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 0xc + lVar22)));
      auVar42 = vunpcklps_avx(auVar61,auVar73);
      auVar92 = vunpcklps_avx(auVar41,auVar77);
      auVar61 = vunpckhps_avx(auVar41,auVar77);
      auVar77 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x10 + lVar22)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 0x18 + lVar22)));
      auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x10 + lVar22)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 0x18 + lVar22)));
      auVar108 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x14 + lVar22)),
                               *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 0x1c + lVar22)));
      auVar41 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x14 + lVar22)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 0x1c + lVar22)));
      auVar36 = vunpcklps_avx(auVar73,auVar41);
      auVar51 = vunpcklps_avx(auVar77,auVar108);
      auVar41 = vunpckhps_avx(auVar77,auVar108);
      auVar108 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x20 + lVar22)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 0x28 + lVar22)));
      auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x20 + lVar22)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 0x28 + lVar22)));
      auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x24 + lVar22)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 0x2c + lVar22)));
      auVar77 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x24 + lVar22)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 0x2c + lVar22)));
      auVar70 = vunpcklps_avx(auVar73,auVar77);
      auVar93 = vunpcklps_avx(auVar108,auVar50);
      auVar50 = vunpckhps_avx(auVar108,auVar50);
      puVar1 = (undefined8 *)(uVar26 + 0x30 + lVar22);
      local_1488 = *puVar1;
      uStack_1480 = puVar1[1];
      puVar1 = (undefined8 *)(uVar26 + 0x40 + lVar22);
      local_1498 = *puVar1;
      uStack_1490 = puVar1[1];
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar108._4_4_ = uVar2;
      auVar108._0_4_ = uVar2;
      auVar108._8_4_ = uVar2;
      auVar108._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar116._4_4_ = uVar2;
      auVar116._0_4_ = uVar2;
      auVar116._8_4_ = uVar2;
      auVar116._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar119._4_4_ = uVar2;
      auVar119._0_4_ = uVar2;
      auVar119._8_4_ = uVar2;
      auVar119._12_4_ = uVar2;
      auVar77 = vsubps_avx(auVar92,auVar108);
      auVar92 = vsubps_avx(auVar61,auVar116);
      auVar61 = vsubps_avx(auVar42,auVar119);
      auVar73 = vsubps_avx(auVar51,auVar108);
      auVar41 = vsubps_avx(auVar41,auVar116);
      auVar42 = vsubps_avx(auVar36,auVar119);
      auVar108 = vsubps_avx(auVar93,auVar108);
      auVar50 = vsubps_avx(auVar50,auVar116);
      auVar36 = vsubps_avx(auVar70,auVar119);
      auVar51 = vsubps_avx(auVar108,auVar77);
      auVar70 = vsubps_avx(auVar50,auVar92);
      auVar93 = vsubps_avx(auVar36,auVar61);
      auVar31._0_4_ = auVar108._0_4_ + auVar77._0_4_;
      auVar31._4_4_ = auVar108._4_4_ + auVar77._4_4_;
      auVar31._8_4_ = auVar108._8_4_ + auVar77._8_4_;
      auVar31._12_4_ = auVar108._12_4_ + auVar77._12_4_;
      auVar48._0_4_ = auVar50._0_4_ + auVar92._0_4_;
      auVar48._4_4_ = auVar50._4_4_ + auVar92._4_4_;
      auVar48._8_4_ = auVar50._8_4_ + auVar92._8_4_;
      auVar48._12_4_ = auVar50._12_4_ + auVar92._12_4_;
      fVar107 = auVar61._0_4_;
      auVar59._0_4_ = auVar36._0_4_ + fVar107;
      fVar47 = auVar61._4_4_;
      auVar59._4_4_ = auVar36._4_4_ + fVar47;
      fVar83 = auVar61._8_4_;
      auVar59._8_4_ = auVar36._8_4_ + fVar83;
      fVar58 = auVar61._12_4_;
      auVar59._12_4_ = auVar36._12_4_ + fVar58;
      auVar117._0_4_ = auVar93._0_4_ * auVar48._0_4_;
      auVar117._4_4_ = auVar93._4_4_ * auVar48._4_4_;
      auVar117._8_4_ = auVar93._8_4_ * auVar48._8_4_;
      auVar117._12_4_ = auVar93._12_4_ * auVar48._12_4_;
      auVar116 = vfmsub231ps_fma(auVar117,auVar70,auVar59);
      auVar60._0_4_ = auVar51._0_4_ * auVar59._0_4_;
      auVar60._4_4_ = auVar51._4_4_ * auVar59._4_4_;
      auVar60._8_4_ = auVar51._8_4_ * auVar59._8_4_;
      auVar60._12_4_ = auVar51._12_4_ * auVar59._12_4_;
      auVar59 = vfmsub231ps_fma(auVar60,auVar93,auVar31);
      auVar32._0_4_ = auVar70._0_4_ * auVar31._0_4_;
      auVar32._4_4_ = auVar70._4_4_ * auVar31._4_4_;
      auVar32._8_4_ = auVar70._8_4_ * auVar31._8_4_;
      auVar32._12_4_ = auVar70._12_4_ * auVar31._12_4_;
      auVar31 = vfmsub231ps_fma(auVar32,auVar51,auVar48);
      fVar100 = *(float *)(ray + k * 4 + 0x60);
      auVar49._0_4_ = fVar100 * auVar31._0_4_;
      auVar49._4_4_ = fVar100 * auVar31._4_4_;
      auVar49._8_4_ = fVar100 * auVar31._8_4_;
      auVar49._12_4_ = fVar100 * auVar31._12_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar84._4_4_ = uVar2;
      auVar84._0_4_ = uVar2;
      auVar84._8_4_ = uVar2;
      auVar84._12_4_ = uVar2;
      auVar59 = vfmadd231ps_fma(auVar49,auVar84,auVar59);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar120._4_4_ = uVar2;
      auVar120._0_4_ = uVar2;
      auVar120._8_4_ = uVar2;
      auVar120._12_4_ = uVar2;
      auVar48 = vfmadd231ps_fma(auVar59,auVar120,auVar116);
      auVar59 = vsubps_avx(auVar92,auVar41);
      auVar116 = vsubps_avx(auVar61,auVar42);
      auVar39._0_4_ = auVar92._0_4_ + auVar41._0_4_;
      auVar39._4_4_ = auVar92._4_4_ + auVar41._4_4_;
      auVar39._8_4_ = auVar92._8_4_ + auVar41._8_4_;
      auVar39._12_4_ = auVar92._12_4_ + auVar41._12_4_;
      auVar61._0_4_ = auVar42._0_4_ + fVar107;
      auVar61._4_4_ = auVar42._4_4_ + fVar47;
      auVar61._8_4_ = auVar42._8_4_ + fVar83;
      auVar61._12_4_ = auVar42._12_4_ + fVar58;
      fVar91 = auVar116._0_4_;
      auVar72._0_4_ = auVar39._0_4_ * fVar91;
      fVar53 = auVar116._4_4_;
      auVar72._4_4_ = auVar39._4_4_ * fVar53;
      fVar55 = auVar116._8_4_;
      auVar72._8_4_ = auVar39._8_4_ * fVar55;
      fVar57 = auVar116._12_4_;
      auVar72._12_4_ = auVar39._12_4_ * fVar57;
      auVar32 = vfmsub231ps_fma(auVar72,auVar59,auVar61);
      auVar31 = vsubps_avx(auVar77,auVar73);
      fVar121 = auVar31._0_4_;
      auVar79._0_4_ = fVar121 * auVar61._0_4_;
      fVar122 = auVar31._4_4_;
      auVar79._4_4_ = fVar122 * auVar61._4_4_;
      fVar123 = auVar31._8_4_;
      auVar79._8_4_ = fVar123 * auVar61._8_4_;
      fVar124 = auVar31._12_4_;
      auVar79._12_4_ = fVar124 * auVar61._12_4_;
      auVar62._0_4_ = auVar77._0_4_ + auVar73._0_4_;
      auVar62._4_4_ = auVar77._4_4_ + auVar73._4_4_;
      auVar62._8_4_ = auVar77._8_4_ + auVar73._8_4_;
      auVar62._12_4_ = auVar77._12_4_ + auVar73._12_4_;
      auVar61 = vfmsub231ps_fma(auVar79,auVar116,auVar62);
      fVar52 = auVar59._0_4_;
      auVar63._0_4_ = auVar62._0_4_ * fVar52;
      fVar54 = auVar59._4_4_;
      auVar63._4_4_ = auVar62._4_4_ * fVar54;
      fVar56 = auVar59._8_4_;
      auVar63._8_4_ = auVar62._8_4_ * fVar56;
      fVar65 = auVar59._12_4_;
      auVar63._12_4_ = auVar62._12_4_ * fVar65;
      auVar35 = vfmsub231ps_fma(auVar63,auVar31,auVar39);
      auVar64._0_4_ = fVar100 * auVar35._0_4_;
      auVar64._4_4_ = fVar100 * auVar35._4_4_;
      auVar64._8_4_ = fVar100 * auVar35._8_4_;
      auVar64._12_4_ = fVar100 * auVar35._12_4_;
      auVar61 = vfmadd231ps_fma(auVar64,auVar84,auVar61);
      local_1468 = vfmadd231ps_fma(auVar61,auVar120,auVar32);
      auVar32 = vsubps_avx(auVar73,auVar108);
      auVar40._0_4_ = auVar73._0_4_ + auVar108._0_4_;
      auVar40._4_4_ = auVar73._4_4_ + auVar108._4_4_;
      auVar40._8_4_ = auVar73._8_4_ + auVar108._8_4_;
      auVar40._12_4_ = auVar73._12_4_ + auVar108._12_4_;
      auVar108 = vsubps_avx(auVar41,auVar50);
      auVar35._0_4_ = auVar41._0_4_ + auVar50._0_4_;
      auVar35._4_4_ = auVar41._4_4_ + auVar50._4_4_;
      auVar35._8_4_ = auVar41._8_4_ + auVar50._8_4_;
      auVar35._12_4_ = auVar41._12_4_ + auVar50._12_4_;
      auVar50 = vsubps_avx(auVar42,auVar36);
      auVar67._0_4_ = auVar42._0_4_ + auVar36._0_4_;
      auVar67._4_4_ = auVar42._4_4_ + auVar36._4_4_;
      auVar67._8_4_ = auVar42._8_4_ + auVar36._8_4_;
      auVar67._12_4_ = auVar42._12_4_ + auVar36._12_4_;
      auVar73._0_4_ = auVar50._0_4_ * auVar35._0_4_;
      auVar73._4_4_ = auVar50._4_4_ * auVar35._4_4_;
      auVar73._8_4_ = auVar50._8_4_ * auVar35._8_4_;
      auVar73._12_4_ = auVar50._12_4_ * auVar35._12_4_;
      auVar73 = vfmsub231ps_fma(auVar73,auVar108,auVar67);
      auVar68._0_4_ = auVar32._0_4_ * auVar67._0_4_;
      auVar68._4_4_ = auVar32._4_4_ * auVar67._4_4_;
      auVar68._8_4_ = auVar32._8_4_ * auVar67._8_4_;
      auVar68._12_4_ = auVar32._12_4_ * auVar67._12_4_;
      auVar61 = vfmsub231ps_fma(auVar68,auVar50,auVar40);
      auVar41._0_4_ = auVar108._0_4_ * auVar40._0_4_;
      auVar41._4_4_ = auVar108._4_4_ * auVar40._4_4_;
      auVar41._8_4_ = auVar108._8_4_ * auVar40._8_4_;
      auVar41._12_4_ = auVar108._12_4_ * auVar40._12_4_;
      auVar41 = vfmsub231ps_fma(auVar41,auVar32,auVar35);
      auVar42._0_4_ = fVar100 * auVar41._0_4_;
      auVar42._4_4_ = fVar100 * auVar41._4_4_;
      auVar42._8_4_ = fVar100 * auVar41._8_4_;
      auVar42._12_4_ = fVar100 * auVar41._12_4_;
      auVar61 = vfmadd231ps_fma(auVar42,auVar84,auVar61);
      auVar42 = vfmadd231ps_fma(auVar61,auVar120,auVar73);
      local_1478 = auVar48._0_4_;
      fStack_1474 = auVar48._4_4_;
      fStack_1470 = auVar48._8_4_;
      fStack_146c = auVar48._12_4_;
      local_1458._0_4_ = auVar42._0_4_ + local_1478 + local_1468._0_4_;
      local_1458._4_4_ = auVar42._4_4_ + fStack_1474 + local_1468._4_4_;
      local_1458._8_4_ = auVar42._8_4_ + fStack_1470 + local_1468._8_4_;
      local_1458._12_4_ = auVar42._12_4_ + fStack_146c + local_1468._12_4_;
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar61 = vminps_avx(auVar48,local_1468);
      auVar73 = vminps_avx(auVar61,auVar42);
      auVar61 = vandps_avx(local_1458,auVar36);
      auVar80._0_4_ = auVar61._0_4_ * 1.1920929e-07;
      auVar80._4_4_ = auVar61._4_4_ * 1.1920929e-07;
      auVar80._8_4_ = auVar61._8_4_ * 1.1920929e-07;
      auVar80._12_4_ = auVar61._12_4_ * 1.1920929e-07;
      uVar27 = CONCAT44(auVar80._4_4_,auVar80._0_4_);
      auVar74._0_8_ = uVar27 ^ 0x8000000080000000;
      auVar74._8_4_ = -auVar80._8_4_;
      auVar74._12_4_ = -auVar80._12_4_;
      auVar73 = vcmpps_avx(auVar73,auVar74,5);
      auVar41 = vmaxps_avx(auVar48,local_1468);
      auVar41 = vmaxps_avx(auVar41,auVar42);
      auVar41 = vcmpps_avx(auVar41,auVar80,2);
      auVar73 = vorps_avx(auVar73,auVar41);
      if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar73[0xf] < '\0'
         ) {
        auVar43._0_4_ = fVar52 * auVar93._0_4_;
        auVar43._4_4_ = fVar54 * auVar93._4_4_;
        auVar43._8_4_ = fVar56 * auVar93._8_4_;
        auVar43._12_4_ = fVar65 * auVar93._12_4_;
        auVar69._0_4_ = fVar121 * auVar70._0_4_;
        auVar69._4_4_ = fVar122 * auVar70._4_4_;
        auVar69._8_4_ = fVar123 * auVar70._8_4_;
        auVar69._12_4_ = fVar124 * auVar70._12_4_;
        auVar70 = vfmsub213ps_fma(auVar70,auVar116,auVar43);
        auVar75._0_4_ = auVar108._0_4_ * fVar91;
        auVar75._4_4_ = auVar108._4_4_ * fVar53;
        auVar75._8_4_ = auVar108._8_4_ * fVar55;
        auVar75._12_4_ = auVar108._12_4_ * fVar57;
        auVar81._0_4_ = fVar121 * auVar50._0_4_;
        auVar81._4_4_ = fVar122 * auVar50._4_4_;
        auVar81._8_4_ = fVar123 * auVar50._8_4_;
        auVar81._12_4_ = fVar124 * auVar50._12_4_;
        auVar50 = vfmsub213ps_fma(auVar50,auVar59,auVar75);
        auVar41 = vandps_avx(auVar43,auVar36);
        auVar42 = vandps_avx(auVar75,auVar36);
        auVar41 = vcmpps_avx(auVar41,auVar42,1);
        local_13f8 = vblendvps_avx(auVar50,auVar70,auVar41);
        auVar76._0_4_ = auVar32._0_4_ * fVar52;
        auVar76._4_4_ = auVar32._4_4_ * fVar54;
        auVar76._8_4_ = auVar32._8_4_ * fVar56;
        auVar76._12_4_ = auVar32._12_4_ * fVar65;
        auVar50 = vfmsub213ps_fma(auVar32,auVar116,auVar81);
        auVar44._0_4_ = auVar51._0_4_ * fVar91;
        auVar44._4_4_ = auVar51._4_4_ * fVar53;
        auVar44._8_4_ = auVar51._8_4_ * fVar55;
        auVar44._12_4_ = auVar51._12_4_ * fVar57;
        auVar70 = vfmsub213ps_fma(auVar93,auVar31,auVar44);
        auVar41 = vandps_avx(auVar44,auVar36);
        auVar42 = vandps_avx(auVar81,auVar36);
        auVar41 = vcmpps_avx(auVar41,auVar42,1);
        local_13e8 = vblendvps_avx(auVar50,auVar70,auVar41);
        auVar50 = vfmsub213ps_fma(auVar51,auVar59,auVar69);
        auVar108 = vfmsub213ps_fma(auVar108,auVar31,auVar76);
        auVar41 = vandps_avx(auVar69,auVar36);
        auVar42 = vandps_avx(auVar76,auVar36);
        auVar41 = vcmpps_avx(auVar41,auVar42,1);
        local_13d8 = vblendvps_avx(auVar108,auVar50,auVar41);
        auVar50._0_4_ = local_13d8._0_4_ * fVar100;
        auVar50._4_4_ = local_13d8._4_4_ * fVar100;
        auVar50._8_4_ = local_13d8._8_4_ * fVar100;
        auVar50._12_4_ = local_13d8._12_4_ * fVar100;
        auVar41 = vfmadd213ps_fma(auVar84,local_13e8,auVar50);
        auVar41 = vfmadd213ps_fma(auVar120,local_13f8,auVar41);
        auVar70._0_4_ = auVar41._0_4_ + auVar41._0_4_;
        auVar70._4_4_ = auVar41._4_4_ + auVar41._4_4_;
        auVar70._8_4_ = auVar41._8_4_ + auVar41._8_4_;
        auVar70._12_4_ = auVar41._12_4_ + auVar41._12_4_;
        auVar51._0_4_ = local_13d8._0_4_ * fVar107;
        auVar51._4_4_ = local_13d8._4_4_ * fVar47;
        auVar51._8_4_ = local_13d8._8_4_ * fVar83;
        auVar51._12_4_ = local_13d8._12_4_ * fVar58;
        auVar41 = vfmadd213ps_fma(auVar92,local_13e8,auVar51);
        auVar77 = vfmadd213ps_fma(auVar77,local_13f8,auVar41);
        auVar41 = vrcpps_avx(auVar70);
        auVar92._8_4_ = 0x3f800000;
        auVar92._0_8_ = 0x3f8000003f800000;
        auVar92._12_4_ = 0x3f800000;
        auVar92 = vfnmadd213ps_fma(auVar41,auVar70,auVar92);
        auVar41 = vfmadd132ps_fma(auVar92,auVar41,auVar41);
        local_1408._0_4_ = (auVar77._0_4_ + auVar77._0_4_) * auVar41._0_4_;
        local_1408._4_4_ = (auVar77._4_4_ + auVar77._4_4_) * auVar41._4_4_;
        local_1408._8_4_ = (auVar77._8_4_ + auVar77._8_4_) * auVar41._8_4_;
        local_1408._12_4_ = (auVar77._12_4_ + auVar77._12_4_) * auVar41._12_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar77._4_4_ = uVar2;
        auVar77._0_4_ = uVar2;
        auVar77._8_4_ = uVar2;
        auVar77._12_4_ = uVar2;
        auVar41 = vcmpps_avx(auVar77,local_1408,2);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar93._4_4_ = uVar2;
        auVar93._0_4_ = uVar2;
        auVar93._8_4_ = uVar2;
        auVar93._12_4_ = uVar2;
        auVar71 = ZEXT1664(auVar93);
        auVar77 = vcmpps_avx(local_1408,auVar93,2);
        auVar41 = vandps_avx(auVar41,auVar77);
        auVar77 = auVar73 & auVar41;
        if ((((auVar77 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar77 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar77[0xf] < '\0') {
          auVar73 = vandps_avx(auVar41,auVar73);
          auVar41 = vcmpps_avx(auVar70,_DAT_01f45a50,4);
          local_1438 = vandps_avx(auVar73,auVar41);
          uVar20 = vmovmskps_avx(local_1438);
          if (uVar20 != 0) {
            local_1448 = &mapUV;
            auVar73 = vrcpps_avx(local_1458);
            auVar45._8_4_ = 0x3f800000;
            auVar45._0_8_ = 0x3f8000003f800000;
            auVar45._12_4_ = 0x3f800000;
            auVar41 = vfnmadd213ps_fma(local_1458,auVar73,auVar45);
            auVar73 = vfmadd132ps_fma(auVar41,auVar73,auVar73);
            auVar37._8_4_ = 0x219392ef;
            auVar37._0_8_ = 0x219392ef219392ef;
            auVar37._12_4_ = 0x219392ef;
            auVar61 = vcmpps_avx(auVar61,auVar37,5);
            auVar61 = vandps_avx(auVar73,auVar61);
            auVar33._0_4_ = local_1478 * auVar61._0_4_;
            auVar33._4_4_ = fStack_1474 * auVar61._4_4_;
            auVar33._8_4_ = fStack_1470 * auVar61._8_4_;
            auVar33._12_4_ = fStack_146c * auVar61._12_4_;
            local_1428 = vminps_avx(auVar33,auVar45);
            auVar34._0_4_ = auVar61._0_4_ * local_1468._0_4_;
            auVar34._4_4_ = auVar61._4_4_ * local_1468._4_4_;
            auVar34._8_4_ = auVar61._8_4_ * local_1468._8_4_;
            auVar34._12_4_ = auVar61._12_4_ * local_1468._12_4_;
            local_1418 = vminps_avx(auVar34,auVar45);
            uVar27 = (ulong)(uVar20 & 0xff);
            do {
              uVar21 = 0;
              for (uVar25 = uVar27; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                uVar21 = uVar21 + 1;
              }
              uVar20 = *(uint *)((long)&local_1488 + uVar21 * 4);
              pGVar11 = (pSVar5->geometries).items[uVar20].ptr;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  uVar25 = (ulong)(uint)((int)uVar21 * 4);
                  local_1398 = *(undefined4 *)(local_1428 + uVar25);
                  uVar2 = *(undefined4 *)(local_1418 + uVar25);
                  local_1388._4_4_ = uVar2;
                  local_1388._0_4_ = uVar2;
                  local_1388._8_4_ = uVar2;
                  local_1388._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar25);
                  args.context = context->user;
                  local_1368._4_4_ = uVar20;
                  local_1368._0_4_ = uVar20;
                  local_1368._8_4_ = uVar20;
                  local_1368._12_4_ = uVar20;
                  uVar2 = *(undefined4 *)((long)&local_1498 + uVar25);
                  local_1378._4_4_ = uVar2;
                  local_1378._0_4_ = uVar2;
                  local_1378._8_4_ = uVar2;
                  local_1378._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_13f8 + uVar25);
                  uVar4 = *(undefined4 *)(local_13e8 + uVar25);
                  local_13b8._4_4_ = uVar4;
                  local_13b8._0_4_ = uVar4;
                  local_13b8._8_4_ = uVar4;
                  local_13b8._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_13d8 + uVar25);
                  local_13a8._4_4_ = uVar4;
                  local_13a8._0_4_ = uVar4;
                  local_13a8._8_4_ = uVar4;
                  local_13a8._12_4_ = uVar4;
                  local_13c8[0] = (RTCHitN)(char)uVar2;
                  local_13c8[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[4] = (RTCHitN)(char)uVar2;
                  local_13c8[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[8] = (RTCHitN)(char)uVar2;
                  local_13c8[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[0xc] = (RTCHitN)(char)uVar2;
                  local_13c8[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_1394 = local_1398;
                  uStack_1390 = local_1398;
                  uStack_138c = local_1398;
                  vpcmpeqd_avx2(ZEXT1632(local_1368),ZEXT1632(local_1368));
                  uStack_1354 = (args.context)->instID[0];
                  local_1358 = uStack_1354;
                  uStack_1350 = uStack_1354;
                  uStack_134c = uStack_1354;
                  uStack_1348 = (args.context)->instPrimID[0];
                  uStack_1344 = uStack_1348;
                  uStack_1340 = uStack_1348;
                  uStack_133c = uStack_1348;
                  local_1598 = *local_1588;
                  args.valid = (int *)local_1598;
                  args.geometryUserPtr = pGVar11->userPtr;
                  args.hit = local_13c8;
                  args.N = 4;
                  auVar61 = auVar71._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar11->occlusionFilterN)(&args);
                    auVar71 = ZEXT1664(auVar61);
                  }
                  if (local_1598 == (undefined1  [16])0x0) {
                    auVar61 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar61 = auVar61 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&args);
                      auVar71 = ZEXT1664(auVar61);
                    }
                    auVar73 = vpcmpeqd_avx(local_1598,_DAT_01f45a50);
                    auVar61 = auVar73 ^ _DAT_01f46b70;
                    auVar46._8_4_ = 0xff800000;
                    auVar46._0_8_ = 0xff800000ff800000;
                    auVar46._12_4_ = 0xff800000;
                    auVar73 = vblendvps_avx(auVar46,*(undefined1 (*) [16])(args.ray + 0x80),auVar73)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar73;
                  }
                  auVar38._8_8_ = 0x100000001;
                  auVar38._0_8_ = 0x100000001;
                  if ((auVar38 & auVar61) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar71._0_4_;
                    goto LAB_0166139e;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01661486;
              }
LAB_0166139e:
              uVar27 = uVar27 ^ 1L << (uVar21 & 0x3f);
            } while (uVar27 != 0);
          }
        }
      }
      auVar71 = ZEXT3264(local_11f8);
      auVar78 = ZEXT3264(local_1218);
      auVar82 = ZEXT3264(local_1238);
      auVar115 = ZEXT3264(local_1318);
      auVar118 = ZEXT3264(local_1338);
      uVar27 = local_1580;
      fVar47 = local_12f8;
      fVar52 = fStack_12f4;
      fVar53 = fStack_12f0;
      fVar54 = fStack_12ec;
      fVar55 = fStack_12e8;
      fVar56 = fStack_12e4;
      fVar57 = fStack_12e0;
      fVar58 = local_1278;
      fVar65 = fStack_1274;
      fVar121 = fStack_1270;
      fVar122 = fStack_126c;
      fVar123 = fStack_1268;
      fVar124 = fStack_1264;
      fVar66 = fStack_1260;
      fVar83 = local_1258;
      fVar85 = fStack_1254;
      fVar86 = fStack_1250;
      fVar87 = fStack_124c;
      fVar88 = fStack_1248;
      fVar89 = fStack_1244;
      fVar90 = fStack_1240;
      fVar91 = local_1298;
      fVar94 = fStack_1294;
      fVar95 = fStack_1290;
      fVar96 = fStack_128c;
      fVar97 = fStack_1288;
      fVar98 = fStack_1284;
      fVar99 = fStack_1280;
      fVar100 = local_12b8;
      fVar101 = fStack_12b4;
      fVar102 = fStack_12b0;
      fVar103 = fStack_12ac;
      fVar104 = fStack_12a8;
      fVar105 = fStack_12a4;
      fVar106 = fStack_12a0;
      fVar107 = local_12d8;
      fVar109 = fStack_12d4;
      fVar110 = fStack_12d0;
      fVar111 = fStack_12cc;
      fVar112 = fStack_12c8;
      fVar113 = fStack_12c4;
      fVar114 = fStack_12c0;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }